

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,3ul>,float>
               (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *src,vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     *dst,vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               float eps)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint *puVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  const_reference pvVar9;
  array<tinyusdz::value::half,_3UL> *__s;
  reference ppVar10;
  reference pvVar11;
  pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_> *v;
  iterator __end0;
  iterator __begin0;
  unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
  *__range3;
  ulong uStack_78;
  uint32_t vidx;
  size_t i;
  undefined1 local_68 [4];
  uint32_t max_vidx;
  unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
  vdata;
  float eps_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *dst_local;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *src_local;
  
  if (dst == (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    vdata._M_h._M_single_bucket._4_4_ = eps;
    sVar3 = ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::size(src);
    sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(faceVertexIndices);
    if (sVar3 == sVar4) {
      sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(faceVertexIndices);
      if (sVar3 < 3) {
        src_local._7_1_ = false;
      }
      else {
        ::std::
        unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
        ::unordered_map((unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                         *)local_68);
        i._4_4_ = 0;
        for (uStack_78 = 0; uVar1 = uStack_78,
            sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (faceVertexIndices), uVar1 < sVar3; uStack_78 = uStack_78 + 1) {
          pvVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (faceVertexIndices,uStack_78);
          __range3._4_4_ = *pvVar5;
          puVar6 = ::std::max<unsigned_int>((uint *)((long)&__range3 + 4),(uint *)((long)&i + 4));
          i._4_4_ = *puVar6;
          sVar7 = ::std::
                  unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                  ::count((unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                           *)local_68,(key_type *)((long)&__range3 + 4));
          if (sVar7 == 0) {
            pvVar9 = ::std::
                     vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ::operator[](src,uStack_78);
            pmVar8 = ::std::
                     unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                     ::operator[]((unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                                   *)local_68,(key_type *)((long)&__range3 + 4));
            *(undefined4 *)pmVar8->_M_elems = *(undefined4 *)pvVar9->_M_elems;
            pmVar8->_M_elems[2].value = pvVar9->_M_elems[2].value;
          }
          else {
            pmVar8 = ::std::
                     unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                     ::operator[]((unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                                   *)local_68,(key_type *)((long)&__range3 + 4));
            pvVar9 = ::std::
                     vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ::operator[](src,uStack_78);
            bVar2 = math::is_close(pmVar8,pvVar9,vdata._M_h._M_single_bucket._4_4_);
            if (!bVar2) {
              src_local._7_1_ = false;
              goto LAB_004ffb92;
            }
          }
        }
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::resize(dst,(ulong)(i._4_4_ + 1));
        __s = ::std::
              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ::data(dst);
        memset(__s,0,(ulong)(i._4_4_ + 1) * 6);
        __end0 = ::std::
                 unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                 ::begin((unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_68);
        v = (pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_> *)
            ::std::
            unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::end((unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)local_68);
        while (bVar2 = ::std::__detail::operator!=
                                 (&__end0.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_false>
                                    *)&v), bVar2) {
          ppVar10 = ::std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_false,_false>
                    ::operator*(&__end0);
          pvVar11 = ::std::
                    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ::operator[](dst,(ulong)ppVar10->first);
          *(undefined4 *)pvVar11->_M_elems = *(undefined4 *)(ppVar10->second)._M_elems;
          pvVar11->_M_elems[2].value = (ppVar10->second)._M_elems[2].value;
          ::std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_false,_false>
          ::operator++(&__end0);
        }
        src_local._7_1_ = true;
LAB_004ffb92:
        __range3._0_4_ = 1;
        ::std::
        unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_68);
      }
    }
    else {
      src_local._7_1_ = false;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}